

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_1::QueryObjectResetCase::waitForReset
          (QueryObjectResetCase *this,
          SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset)

{
  ContextReset *pCVar1;
  GLenum err;
  
  pCVar1 = contextReset->m_ptr;
  (*pCVar1->m_gl->endQuery)(0x8c2f);
  err = (*pCVar1->m_gl->getError)();
  glu::checkError(err,"endQuery(GL_ANY_SAMPLES_PASSED)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x2a2);
  (*contextReset->m_ptr->_vptr_ContextReset[4])();
  ContextReset::finish(contextReset->m_ptr);
  return;
}

Assistant:

virtual void waitForReset (de::SharedPtr<ContextReset>& contextReset)
	{
		contextReset->endQuery();
		contextReset->teardown();
		contextReset->finish();
	}